

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
          *this)

{
  ID_index IVar1;
  bool bVar2;
  Index IVar3;
  int iVar4;
  Dimension DVar5;
  uint uVar6;
  uint uVar7;
  Base_matrix *pBVar8;
  reference this_00;
  reference pvVar9;
  reference puVar10;
  pointer ppVar11;
  Column *pCVar12;
  ulong uVar13;
  size_type sVar14;
  reference pvVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar16;
  uint local_28c;
  ID_index local_27c;
  uint local_24c;
  ID_index local_23c;
  uint local_194;
  uint local_190;
  uint d;
  Index i_2;
  Persistence_interval<int,_unsigned_int> *local_180;
  int local_174;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_170;
  undefined1 local_168;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_160;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_158;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_150;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_148;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_140;
  uint local_134;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_130;
  Index pivotKiller;
  iterator itNeg;
  ID_index local_11c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_118;
  Index pivotColumnNumber;
  iterator it;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_108;
  ID_index pivot;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_100;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  *local_f8;
  Column *curr;
  const_iterator cStack_e8;
  Index i_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cols;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2_1;
  reference pvStack_a8;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  undefined1 local_80 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  int dim;
  allocator<std::pair<const_unsigned_int,_unsigned_int>_> local_53;
  key_equal local_52;
  hasher local_51;
  undefined1 local_50 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  Index nullIndex;
  Pos_index nullDeath;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  *this_local;
  
  negativeColumns._M_h._M_single_bucket._4_4_ = 0xffffffff;
  negativeColumns._M_h._M_single_bucket._0_4_ = 0xffffffff;
  pBVar8 = _matrix(this);
  IVar3 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
          ::get_number_of_columns(pBVar8);
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::allocator(&local_53);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_50,(ulong)IVar3,&local_51,&local_52,&local_53);
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::~allocator(&local_53);
  pBVar8 = _matrix(this);
  columnsByDim.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       Matrix_all_dimension_holder<int>::get_max_dimension(&pBVar8->super_Matrix_dimension_option);
  iVar4 = (int)columnsByDim.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&__range2 + 7));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_80,(long)iVar4,
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
           ((long)&__range2 + 7));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&__range2 + 7));
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_80);
  v = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_80);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&v), bVar2) {
    pvVar9 = __gnu_cxx::
             __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator*(&__end0);
    pvStack_a8 = pvVar9;
    pBVar8 = _matrix(this);
    IVar3 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
            ::get_number_of_columns(pBVar8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar9,(ulong)IVar3);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
  }
  __range2_1._4_4_ = 0;
  while( true ) {
    uVar6 = __range2_1._4_4_;
    pBVar8 = _matrix(this);
    IVar3 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
            ::get_number_of_columns(pBVar8);
    iVar4 = (int)columnsByDim.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (IVar3 <= uVar6) break;
    pBVar8 = _matrix(this);
    DVar5 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
            ::get_column_dimension(pBVar8,__range2_1._4_4_);
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)local_80,(long)(iVar4 - DVar5));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_00,(value_type_conflict *)((long)&__range2_1 + 4));
    __range2_1._4_4_ = __range2_1._4_4_ + 1;
  }
  __end0_1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_80);
  cols = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::
         vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_80);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                             *)&cols), bVar2) {
    pvVar9 = __gnu_cxx::
             __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator*(&__end0_1);
    __end0_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar9);
    cStack_e8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar9);
    while (bVar2 = __gnu_cxx::operator!=(&__end0_2,&stack0xffffffffffffff18), bVar2) {
      puVar10 = __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end0_2);
      curr._4_4_ = *puVar10;
      pBVar8 = _matrix(this);
      local_f8 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                 ::get_column(pBVar8,curr._4_4_);
      bVar2 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
              ::is_empty(local_f8);
      if (bVar2) {
        local_100._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)local_50,(key_type *)((long)&curr + 4));
        _Stack_108._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
        bVar2 = std::__detail::operator==(&local_100,&stack0xfffffffffffffef8);
        if (bVar2) {
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                    ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                      *)&this->barcode_,(uint *)((long)&curr + 4),
                     (uint *)((long)&negativeColumns._M_h._M_single_bucket + 4),
                     (int *)&columnsByDim.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
        _4_4_ = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                ::get_pivot(local_f8);
        _Stack_118._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find(&this->idToPosition_,
                    (key_type *)
                    ((long)&it.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur + 4));
        itNeg = std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::end(&this->idToPosition_);
        bVar2 = std::__detail::operator==
                          (&stack0xfffffffffffffee8,
                           &itNeg.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          );
        if (bVar2) {
          local_23c = it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur._4_4_;
        }
        else {
          ppVar11 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                *)&stack0xfffffffffffffee8);
          local_23c = ppVar11->second;
        }
        local_11c = local_23c;
        _Stack_130._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)local_50,&local_11c);
        local_140._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
        bVar2 = std::__detail::operator==(&stack0xfffffffffffffed0,&local_140);
        if (bVar2) {
          local_24c = 0xffffffff;
        }
        else {
          ppVar11 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                *)&stack0xfffffffffffffed0);
          local_24c = ppVar11->second;
        }
        local_134 = local_24c;
        while( true ) {
          IVar1 = it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur._4_4_;
          uVar7 = Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
                  ::get_null_value<unsigned_int>();
          uVar6 = local_134;
          bVar2 = false;
          if (IVar1 != uVar7) {
            uVar7 = Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
                    ::get_null_value<unsigned_int>();
            bVar2 = uVar6 != uVar7;
          }
          IVar1 = it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur._4_4_;
          if (!bVar2) break;
          pBVar8 = _matrix(this);
          pCVar12 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                    ::get_column(pBVar8,local_134);
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
          ::operator+=(local_f8,pCVar12);
          it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
          _4_4_ = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                  ::get_pivot(local_f8);
          local_148._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::find(&this->idToPosition_,
                      (key_type *)
                      ((long)&it.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 4));
          _Stack_118._M_cur = local_148._M_cur;
          local_150._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end(&this->idToPosition_);
          bVar2 = std::__detail::operator==(&stack0xfffffffffffffee8,&local_150);
          if (bVar2) {
            local_27c = it.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur._4_4_;
          }
          else {
            ppVar11 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                  *)&stack0xfffffffffffffee8);
            local_27c = ppVar11->second;
          }
          local_11c = local_27c;
          local_158._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_50,&local_11c);
          _Stack_130._M_cur = local_158._M_cur;
          local_160._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)local_50);
          bVar2 = std::__detail::operator==(&stack0xfffffffffffffed0,&local_160);
          if (bVar2) {
            local_28c = 0xffffffff;
          }
          else {
            ppVar11 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                  *)&stack0xfffffffffffffed0);
            local_28c = ppVar11->second;
          }
          local_134 = local_28c;
        }
        uVar6 = Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
                ::get_null_value<unsigned_int>();
        if (IVar1 == uVar6) {
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
          ::clear(local_f8);
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                    ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                      *)&this->barcode_,(uint *)((long)&curr + 4),
                     (uint *)((long)&negativeColumns._M_h._M_single_bucket + 4),
                     (int *)&columnsByDim.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          pVar16 = std::
                   unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                   ::emplace<unsigned_int&,unsigned_int&>
                             ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                               *)local_50,&local_11c,(uint *)((long)&curr + 4));
          local_170._M_cur =
               (__node_type *)
               pVar16.first.
               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
          local_168 = pVar16.second;
          pBVar8 = _matrix(this);
          pCVar12 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                    ::get_column(pBVar8,local_11c);
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
          ::clear(pCVar12);
          local_174 = (int)columnsByDim.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + -1;
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int&,int>
                    ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                      *)&this->barcode_,&local_11c,(uint *)((long)&curr + 4),&local_174);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end0_2);
    }
    columnsByDim.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)columnsByDim.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + -1;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0_1);
  }
  local_180 = (Persistence_interval<int,_unsigned_int> *)
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ::begin(&this->barcode_);
  _i_2 = std::
         vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end(&this->barcode_);
  std::
  sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>
            (local_180,_i_2);
  for (local_190 = 0; uVar13 = (ulong)local_190,
      sVar14 = std::
               vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ::size(&this->barcode_), uVar13 < sVar14; local_190 = local_190 + 1) {
    pvVar15 = std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ::operator[](&this->barcode_,(ulong)local_190);
    uVar6 = pvVar15->death;
    local_194 = uVar6;
    uVar7 = Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
            ::get_null_value<unsigned_int>();
    if (uVar6 != uVar7) {
      std::
      unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::emplace<unsigned_int&,unsigned_int&>
                ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)&this->deathToBar_,&local_194,&local_190);
    }
  }
  this->isReduced_ = true;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_80);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}